

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void kratos::DeadCodeVarElimination::clear_out_ports(Generator *generator)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  long lVar3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  undefined1 auVar5 [8];
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports_to_remove;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (generator->parent_generator_ != (Generator *)0x0) {
    auStack_58 = (undefined1  [8])0x0;
    ports_to_remove.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ports_to_remove.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var4 = (generator->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(generator->ports_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        Generator::get_port((Generator *)
                            &ports_to_remove.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)generator)
        ;
        if (*(int *)&ports_to_remove.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[0x13].field_2 == 1) {
          lVar3 = (**(code **)(((ports_to_remove.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus).
                               _M_p + 0x80))();
LAB_003d28fa:
          if (*(long *)(lVar3 + 0x18) == 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       auStack_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var4 + 1));
          }
        }
        else if (*(int *)&ports_to_remove.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[0x13].field_2 == 0) {
          lVar3 = (**(code **)(((ports_to_remove.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus).
                               _M_p + 0x70))();
          goto LAB_003d28fa;
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        pbVar2 = ports_to_remove.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
      if (auStack_58 !=
          (undefined1  [8])
          ports_to_remove.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        auVar5 = auStack_58;
        do {
          Generator::get_port((Generator *)
                              &ports_to_remove.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (string *)generator);
          remove_var((Var *)ports_to_remove.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          auVar5 = (undefined1  [8])((long)auVar5 + 0x20);
        } while (auVar5 != (undefined1  [8])pbVar2);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_58);
  }
  return;
}

Assistant:

static void clear_out_ports(Generator* generator) {
        // we don't deal with top level ports, since it changes
        // interface
        if (!generator->parent_generator()) return;
        auto const& port_names = generator->get_port_names();
        std::vector<std::string> ports_to_remove;
        for (auto const& port_name : port_names) {
            auto const& p = generator->get_port(port_name);
            if (p->port_direction() == PortDirection::In) {
                if (p->sinks().empty()) {
                    ports_to_remove.emplace_back(port_name);
                }
            } else if (p->port_direction() == PortDirection::Out) {
                if (p->sources().empty()) {
                    ports_to_remove.emplace_back(port_name);
                }
            }
        }

        for (auto const& port_name : ports_to_remove) {
            // need to un-wire the parent
            auto const& port = generator->get_port(port_name);
            remove_var(port.get());
        }
    }